

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

void __thiscall QSimplex::reducedRowEchelon(QSimplex *this)

{
  int i;
  int fromIndex;
  
  for (fromIndex = 1; fromIndex < this->rows; fromIndex = fromIndex + 1) {
    combineRows(this,0,fromIndex,
                -this->matrix[(int)this->matrix[(long)fromIndex * (long)this->columns]]);
  }
  return;
}

Assistant:

void QSimplex::reducedRowEchelon()
{
    for (int i = 1; i < rows; ++i) {
        int factorInObjectiveRow = valueAt(i, 0);
        combineRows(0, i, -1 * valueAt(0, factorInObjectiveRow));
    }
}